

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_quaternion.c
# Opt level: O3

char * test_quaternion_multiply_identity(void)

{
  int iVar1;
  char *pcVar2;
  quaternion q;
  quaternion qB;
  anon_union_32_3_07544b10_for_quaternion_0 local_78;
  quaternion local_58;
  quaternion local_38;
  
  local_78.q[0] = 1.0;
  local_78.q[1] = 2.0;
  local_78.q[2] = 3.0;
  local_78.q[3] = 4.0;
  quaternion_identity(&local_38);
  quaternion_set(&local_58,(quaternion *)&local_78.field_1);
  quaternion_multiply(&local_58,&local_38);
  iVar1 = quaternion_equals(&local_58,(quaternion *)&local_78.field_1);
  pcVar2 = (char *)0x0;
  if (iVar1 == 0) {
    pcVar2 = 
    "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(136) : (assertion failed) ((quaternion_equals(&q, &qA)))"
    ;
  }
  return pcVar2;
}

Assistant:

static char *test_quaternion_multiply_identity(void)
{
	struct quaternion qA, qB, q;

	qA.x = 1;
	qA.y = 2;
	qA.z = 3;
	qA.w = 4;

	quaternion_identity(&qB);

	quaternion_set(&q, &qA);
	quaternion_multiply(&q, &qB);

	test_assert(quaternion_equals(&q, &qA));

	return NULL;
}